

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O1

void __thiscall
SuiteSessionTests::initiatorFixtureResendRequest_SessionTypeFIX_DictionaryPreservesFieldOrderHelper
::~initiatorFixtureResendRequest_SessionTypeFIX_DictionaryPreservesFieldOrderHelper
          (initiatorFixtureResendRequest_SessionTypeFIX_DictionaryPreservesFieldOrderHelper *this)

{
  sessionFixture::~sessionFixture((sessionFixture *)&this[-1].m_details);
  operator_delete(&this[-1].m_details,0x630);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, ResendRequest_SessionTypeFIX_DictionaryPreservesFieldOrder) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );

  SessionID sessionID( BeginString( "FIX.4.2" ), SenderCompID( "TW" ), TargetCompID( "ISLD" ) );

  TimeRange sessionTime( startTime, endTime, 0, 31);

  DataDictionaryProvider provider;
  provider.addTransportDataDictionary( sessionID.getBeginString(), "../spec/FIX42.xml" );
  DataDictionary dictionary = provider.getSessionDataDictionary(sessionID.getBeginString());
  dictionary.preserveMessageFieldsOrder(true);

  std::shared_ptr<DataDictionary> pDataDictionary = std::make_shared<DataDictionary>(dictionary);
  pDataDictionary->addHeaderField(115, false);
  pDataDictionary->addTrailerField(115, false);
  pDataDictionary->addMsgField(FIX::MsgType_Logon, 115);
  pDataDictionary->addMsgField(FIX::MsgType_ResendRequest, 115);

  provider.addTransportDataDictionary( sessionID.getBeginString(), pDataDictionary );

  object = new Session( *this, factory, sessionID, provider,
                         sessionTime, 1, 0 );

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->logon();

  FIX::Message receivedLogon = createLogon( "ISLD", "TW", 1 );
  object->next(receivedLogon, UtcTimeStamp());

  FIX::Message resendReq = createResendRequest( "ISLD", "TW", 2, 1, 2);
  object->next(resendReq, UtcTimeStamp());

  CHECK_EQUAL(3, object->getExpectedSenderNum());
  CHECK_EQUAL(2, object->getExpectedTargetNum());
}